

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O0

int set_bucket_realloc_iterator(set s,set_key key,set_value value,set_cb_iterate_args args)

{
  int iVar1;
  bucket b_00;
  long *in_RCX;
  long in_RSI;
  long *in_RDI;
  bucket b;
  size_t index;
  set_hash h;
  set new_set;
  int local_4;
  
  if (((in_RCX == in_RDI) || (in_RSI == 0)) || (in_RCX == (long *)0x0)) {
    local_4 = 1;
  }
  else {
    b_00 = (bucket)(*(code *)in_RCX[4])(in_RSI);
    iVar1 = bucket_insert(b_00,(void *)((ulong)b_00 % (ulong)in_RCX[1]),
                          (void *)(in_RCX[3] + (long)((ulong)b_00 % (ulong)in_RCX[1]) * 0x18));
    if (iVar1 == 0) {
      *in_RCX = *in_RCX + 1;
      local_4 = 0;
    }
    else {
      log_write_impl_va("metacall",0x81,"set_bucket_realloc_iterator",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_set.c"
                        ,LOG_LEVEL_ERROR,"Invalid set bucket realloc insertion");
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int set_bucket_realloc_iterator(set s, set_key key, set_value value, set_cb_iterate_args args)
{
	set new_set = (set)args;

	if (new_set != s && key != NULL && args != NULL)
	{
		set_hash h = new_set->hash_cb(key);

		size_t index = h % new_set->capacity;

		bucket b = &new_set->buckets[index];

		if (bucket_insert(b, key, value) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid set bucket realloc insertion");
			return 1;
		}

		++new_set->count;

		return 0;
	}

	return 1;
}